

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

CURLcode error_unencode_write(Curl_easy *data,contenc_writer *writer,char *buf,size_t nbytes)

{
  CURLcode CVar1;
  char *pcVar2;
  
  pcVar2 = Curl_all_content_encodings();
  if (pcVar2 == (char *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    Curl_failf(data,"Unrecognized content encoding type. libcurl understands %s content encodings.",
               pcVar2);
    (*Curl_cfree)(pcVar2);
    CVar1 = CURLE_BAD_CONTENT_ENCODING;
  }
  return CVar1;
}

Assistant:

static CURLcode error_unencode_write(struct Curl_easy *data,
                                     struct contenc_writer *writer,
                                     const char *buf, size_t nbytes)
{
  char *all = Curl_all_content_encodings();

  (void) writer;
  (void) buf;
  (void) nbytes;

  if(!all)
    return CURLE_OUT_OF_MEMORY;
  failf(data, "Unrecognized content encoding type. "
        "libcurl understands %s content encodings.", all);
  free(all);
  return CURLE_BAD_CONTENT_ENCODING;
}